

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O0

void memory_region_filter_subregions_riscv64(MemoryRegion_conflict *mr,int32_t level)

{
  MemoryRegion *pMVar1;
  MemoryRegion_conflict *subregion_next;
  MemoryRegion_conflict *subregion;
  int32_t level_local;
  MemoryRegion_conflict *mr_local;
  
  memory_region_transaction_begin_riscv64();
  pMVar1 = (mr->subregions).tqh_first;
  while (subregion_next = (MemoryRegion_conflict *)pMVar1,
        subregion_next != (MemoryRegion_conflict *)0x0) {
    pMVar1 = (subregion_next->subregions_link).tqe_next;
    if (level <= subregion_next->priority) {
      memory_region_del_subregion_riscv64(mr,subregion_next);
      (*subregion_next->destructor)((MemoryRegion *)subregion_next);
      g_free(subregion_next);
      mr->uc->memory_region_update_pending = true;
    }
  }
  memory_region_transaction_commit_riscv64(mr);
  return;
}

Assistant:

void memory_region_filter_subregions(MemoryRegion *mr, int32_t level)
{
    MemoryRegion *subregion, *subregion_next;
    memory_region_transaction_begin();
    QTAILQ_FOREACH_SAFE(subregion, &mr->subregions, subregions_link, subregion_next) {
        if (subregion->priority >= level) {
            memory_region_del_subregion(mr, subregion);
            subregion->destructor(subregion);
            g_free(subregion);
            mr->uc->memory_region_update_pending = true;
        }
    }
    memory_region_transaction_commit(mr);
}